

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t al_ustr_size_utf16(ALLEGRO_USTR *us)

{
  uint in_EAX;
  uint32_t uc;
  uint uVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  int pos;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  uVar1 = al_ustr_get_next(us,(int *)((long)&uStack_28 + 4));
  if ((int)uVar1 < 0) {
    sVar4 = 2;
  }
  else {
    lVar3 = 0;
    do {
      lVar2 = (ulong)(uVar1 < 0x110000) << 2;
      if (uVar1 < 0x10000) {
        lVar2 = 2;
      }
      lVar3 = lVar3 + lVar2;
      uVar1 = al_ustr_get_next(us,(int *)((long)&uStack_28 + 4));
    } while (-1 < (int)uVar1);
    sVar4 = lVar3 + 2;
  }
  return sVar4;
}

Assistant:

size_t al_ustr_size_utf16(const ALLEGRO_USTR *us)
{
   int pos = 0;
   size_t sz = 0;
   while (1) {
      int32_t c = al_ustr_get_next(us, &pos);
      if (c < 0)
         break;
      sz += al_utf16_width(c);
   }
   /* Size of terminating 0 character - al_ustr_get_next will not
    * return it.
    */
   sz += 2;
   return sz;
}